

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMFInterpolater.cpp
# Opt level: O3

void __thiscall
amrex::EBMFCellConsLinInterp::interp
          (EBMFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  ulong uVar1;
  uint uVar2;
  EBCellFlagFab *this_00;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  FabType FVar6;
  FabType FVar7;
  uint uVar8;
  EBFArrayBoxFactory *this_01;
  long lVar9;
  FabArray<amrex::EBCellFlagFab> *this_02;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  Box lhs;
  MFIter mfi;
  ulong local_2a0;
  Box local_270;
  FabArray<amrex::FArrayBox> *local_250;
  FabArray<amrex::EBCellFlagFab> *local_248;
  MFCellConsLinInterp *local_240;
  long local_238;
  long local_230;
  ulong local_228;
  long local_220;
  long local_218;
  double *local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  double *local_1d0;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  EBCellFlag *local_1a0;
  ulong local_198;
  ulong local_190;
  long local_188;
  long local_180;
  ulong local_178;
  undefined1 local_170 [32];
  int local_150;
  int local_14c;
  int local_148;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  MFIter local_b0;
  Box local_4c;
  
  local_240 = &this->super_MFCellConsLinInterp;
  MFCellConsLinInterp::interp
            (&this->super_MFCellConsLinInterp,crsemf,ccomp,finemf,fcomp,nc,ng,cgeom,fgeom,
             dest_domain,ratio,bcs,bcomp);
  local_250 = &finemf->super_FabArray<amrex::FArrayBox>;
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast((finemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  lVar9 = __dynamic_cast((crsemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if ((lVar9 != 0 && this_01 != (EBFArrayBoxFactory *)0x0) &&
     (bVar5 = EBFArrayBoxFactory::isAllRegular(this_01), !bVar5)) {
    this_02 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar9 + 0xd8));
    local_248 = EBDataCollection::getMultiEBCellFlagFab
                          ((this_01->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    MFIter::MFIter(&local_b0,&local_250->super_FabArrayBase,'\0');
    if (local_b0.currentIndex < local_b0.endIndex) {
      local_228 = (ulong)(uint)nc;
      local_230 = (long)ccomp;
      local_238 = (long)fcomp;
      do {
        BATransformer::operator()
                  ((Box *)local_170,&((local_b0.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_b0.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_b0.currentIndex] * 0x1c +
                          *(long *)&((((local_b0.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        local_270.smallend.vect[2] = local_170._8_4_ - ng->vect[2];
        local_270.bigend.vect[2] = ng->vect[2] + local_170._20_4_;
        local_270.btype.itype = local_170._24_4_;
        uVar2 = (dest_domain->smallend).vect[2];
        if (local_270.smallend.vect[2] <= (int)uVar2) {
          local_270.smallend.vect[2] = uVar2;
        }
        iVar15 = (int)*(undefined8 *)ng->vect;
        iVar12 = local_170._12_4_ + iVar15;
        iVar16 = (int)((ulong)*(undefined8 *)ng->vect >> 0x20);
        iVar13 = local_170._16_4_ + iVar16;
        uVar1 = *(ulong *)(dest_domain->smallend).vect;
        iVar15 = (int)local_170._0_8_ - iVar15;
        iVar16 = SUB84(local_170._0_8_,4) - iVar16;
        uVar14 = CONCAT44(-(uint)((int)(uVar1 >> 0x20) < iVar16),-(uint)((int)uVar1 < iVar15));
        local_270.smallend.vect._0_8_ = ~uVar14 & uVar1 | CONCAT44(iVar16,iVar15) & uVar14;
        uVar1 = *(ulong *)(dest_domain->bigend).vect;
        uVar14 = CONCAT44(-(uint)(iVar13 < (int)(uVar1 >> 0x20)),-(uint)(iVar12 < (int)uVar1));
        local_270.bigend.vect._0_8_ = ~uVar14 & uVar1 | CONCAT44(iVar13,iVar12) & uVar14;
        uVar2 = (dest_domain->bigend).vect[2];
        if ((int)uVar2 <= local_270.bigend.vect[2]) {
          local_270.bigend.vect[2] = uVar2;
        }
        MFCellConsLinInterp::CoarseBox(&local_4c,local_240,&local_270,ratio);
        lVar9 = (long)local_b0.currentIndex;
        if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          lVar9 = (long)((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9];
        }
        if (*(int *)&((crsemf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar9]->super_BaseFab<double>).
                     field_0x44 != 0) {
          this_00 = (this_02->m_fabs_v).
                    super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9];
          FVar6 = EBCellFlagFab::getType
                            ((local_248->m_fabs_v).
                             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar9],&local_270);
          FVar7 = EBCellFlagFab::getType(this_00,&local_4c);
          if ((FVar6 == multivalued) || (FVar7 == multivalued)) {
            Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
          }
          else if (FVar6 != covered) {
            FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                      ((Array4<const_amrex::EBCellFlag> *)local_170,this_02,&local_b0);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_250,&local_b0);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_130,&crsemf->super_FabArray<amrex::FArrayBox>,&local_b0);
            if (0 < nc) {
              local_2a0 = 0;
              do {
                if (local_270.smallend.vect[2] <= local_270.bigend.vect[2]) {
                  local_218 = local_230 + local_2a0;
                  local_220 = local_238 + local_2a0;
                  uVar2 = local_270.smallend.vect[2];
                  do {
                    if (local_270.smallend.vect[1] <= local_270.bigend.vect[1]) {
                      iVar12 = ratio->vect[0];
                      iVar13 = ratio->vect[1];
                      iVar15 = ratio->vect[2];
                      local_1a0 = (EBCellFlag *)local_170._0_8_;
                      local_1b0 = (long)local_150;
                      local_1b8 = (long)local_14c;
                      local_1c0 = (long)local_148;
                      uVar3 = local_270.smallend.vect[1];
                      do {
                        if (local_270.smallend.vect[0] <= local_270.bigend.vect[0]) {
                          local_1d0 = local_130.p;
                          local_1d8 = local_130.jstride;
                          local_1e0 = (long)local_130.begin.x;
                          local_1e8 = (long)local_130.begin.y;
                          local_1f0 = (long)local_130.begin.z;
                          local_1f8 = local_130.kstride;
                          local_200 = local_130.nstride * local_218;
                          local_208 = (long)local_f0.begin.x;
                          local_210 = local_f0.p +
                                      ((long)(int)uVar3 - (long)local_f0.begin.y) * local_f0.jstride
                                      + ((long)(int)uVar2 - (long)local_f0.begin.z) *
                                        local_f0.kstride + local_f0.nstride * local_220;
                          uVar4 = local_270.smallend.vect[0];
                          do {
                            local_178 = (ulong)uVar4;
                            uVar10 = uVar4;
                            if (iVar12 != 1) {
                              if (iVar12 == 4) {
                                if ((int)uVar4 < 0) {
                                  uVar10 = (int)uVar4 >> 2;
                                }
                                else {
                                  uVar10 = uVar4 >> 2;
                                }
                              }
                              else if (iVar12 == 2) {
                                if ((int)uVar4 < 0) {
                                  uVar10 = (int)uVar4 >> 1;
                                }
                                else {
                                  uVar10 = uVar4 >> 1;
                                }
                              }
                              else if ((int)uVar4 < 0) {
                                uVar10 = ~((int)~uVar4 / iVar12);
                              }
                              else {
                                uVar10 = (int)uVar4 / iVar12;
                              }
                            }
                            uVar11 = uVar3;
                            if (((iVar13 != 1) && (uVar11 = (int)uVar3 >> 2, iVar13 != 4)) &&
                               (uVar11 = (int)uVar3 >> 1, iVar13 != 2)) {
                              if ((int)uVar3 < 0) {
                                uVar11 = ~((int)~uVar3 / iVar13);
                              }
                              else {
                                uVar11 = (int)uVar3 / iVar13;
                              }
                            }
                            uVar8 = uVar2;
                            if (((iVar15 != 1) && (uVar8 = (int)uVar2 >> 2, iVar15 != 4)) &&
                               (uVar8 = (int)uVar2 >> 1, iVar15 != 2)) {
                              if ((int)uVar2 < 0) {
                                uVar8 = ~((int)~uVar2 / iVar15);
                              }
                              else {
                                uVar8 = (int)uVar2 / iVar15;
                              }
                            }
                            local_180 = (long)(int)uVar10;
                            local_188 = (long)(int)uVar11;
                            uVar10 = ((EBCellFlag *)
                                     (local_170._0_8_ +
                                     ((local_188 - local_1b8) *
                                      CONCAT44(local_170._12_4_,local_170._8_4_) +
                                     (local_180 - local_1b0) +
                                     ((int)uVar8 - local_1c0) *
                                     CONCAT44(local_170._20_4_,local_170._16_4_)) * 4))->flag;
                            if (((uVar10 >> 0xf & 1) - ((int)uVar10 >> 0x1f)) +
                                (uint)((uVar10 >> 0x10 & 1) != 0) + (uVar10 >> 0x11 & 1) +
                                (uint)((uVar10 >> 0x13 & 1) != 0) + (uVar10 >> 0x14 & 1) +
                                (uint)((uVar10 >> 0x15 & 1) != 0) + (uVar10 >> 0x16 & 1) +
                                (uint)((uVar10 >> 5 & 1) != 0) + (uVar10 >> 6 & 1) +
                                (uint)((uVar10 >> 7 & 1) != 0) + (uVar10 >> 8 & 1) +
                                (uint)((uVar10 >> 9 & 1) != 0) + (uVar10 >> 10 & 1) +
                                (uint)((uVar10 >> 0xb & 1) != 0) + (uVar10 >> 0xc & 1) +
                                (uint)((uVar10 >> 0xd & 1) != 0) + (uVar10 >> 0x17 & 1) +
                                (uint)((uVar10 >> 0x18 & 1) != 0) + (uVar10 >> 0x19 & 1) +
                                (uint)((uVar10 >> 0x1a & 1) != 0) + (uVar10 >> 0x1b & 1) +
                                (uint)((uVar10 >> 0x1c & 1) != 0) + (uVar10 >> 0x1d & 1) +
                                (uint)((uVar10 >> 0x1e & 1) != 0) + 1 +
                                (uint)((uVar10 >> 0xe & 1) != 0) < 0x1b) {
                              local_210[(int)uVar4 - local_208] =
                                   local_130.p
                                   [(local_188 - local_1e8) * local_130.jstride +
                                    (local_180 - local_1e0) +
                                    ((int)uVar8 - local_1f0) * local_130.kstride + local_200];
                            }
                            bVar5 = uVar4 != local_270.bigend.vect[0];
                            uVar4 = uVar4 + 1;
                            local_190 = (ulong)uVar3;
                          } while (bVar5);
                        }
                        bVar5 = uVar3 != local_270.bigend.vect[1];
                        uVar3 = uVar3 + 1;
                        local_198 = (ulong)uVar2;
                      } while (bVar5);
                    }
                    bVar5 = uVar2 != local_270.bigend.vect[2];
                    uVar2 = uVar2 + 1;
                  } while (bVar5);
                }
                local_2a0 = local_2a0 + 1;
              } while (local_2a0 != local_228);
            }
          }
        }
        MFIter::operator++(&local_b0);
      } while (local_b0.currentIndex < local_b0.endIndex);
    }
    MFIter::~MFIter(&local_b0);
  }
  return;
}

Assistant:

void
EBMFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                               IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                               Box const& dest_domain, IntVect const& ratio,
                               Vector<BCRec> const& bcs, int bcomp)
{
    MFCellConsLinInterp::interp(crsemf, ccomp, finemf, fcomp, nc, ng, cgeom, fgeom, dest_domain,
                                ratio, bcs, bcomp);

    auto const ffact = dynamic_cast<EBFArrayBoxFactory const*>(&finemf.Factory());
    auto const cfact = dynamic_cast<EBFArrayBoxFactory const*>(&crsemf.Factory());
    if (!ffact || !cfact || ffact->isAllRegular()) {
        return;
    }

    auto const& cflags = cfact->getMultiEBCellFlagFab();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        auto const& cflg = cflags.const_arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                int ic = amrex::coarsen(i,ratio[0]);
                int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                int kc = k;
#else
                int kc = amrex::coarsen(k,ratio[2]);
#endif
                if (cflg[box_no](ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);
                }
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
        auto const& fflags = ffact->getMultiEBCellFlagFab();
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            Box const target_fine_region = amrex::grow(mfi.validbox(),ng) & dest_domain;
            Box const& crse_bx = CoarseBox(target_fine_region, ratio);
            const EBCellFlagFab& crse_flag_fab = cflags[mfi];
            if (crsemf[mfi].getType() != FabType::regular) {
                const EBCellFlagFab& fine_flag_fab = fflags[mfi];
                const FabType ftype = fine_flag_fab.getType(target_fine_region);
                const FabType ctype = crse_flag_fab.getType(crse_bx);
                if (ftype == FabType::multivalued || ctype == FabType::multivalued)
                {
                    amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
                }
                else if (ftype == FabType::covered)
                {
                    ; // don't need to do anything special
                }
                else
                {
                    const auto& crse_flag = cflags.const_array(mfi);
                    const auto& fine = finemf.array(mfi);
                    const auto& crse = crsemf.const_array(mfi);
                    amrex::LoopConcurrentOnCpu(target_fine_region, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        int ic = amrex::coarsen(i,ratio[0]);
                        int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                        int kc = k;
#else
                        int kc = amrex::coarsen(k,ratio[2]);
#endif
                        if (crse_flag(ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                            fine(i,j,k,n+fcomp) = crse(ic,jc,kc,n+ccomp);
                        }
                    });
                }
            }
        }
    }
}